

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>::reallocateAndGrow
          (QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *old)

{
  long lVar1;
  bool bVar2;
  QGenericArrayOps<QTextBrowserPrivate::HistoryEntry> *this_00;
  HistoryEntry *b;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> dp;
  undefined4 in_stack_ffffffffffffff78;
  AllocationOption in_stack_ffffffffffffff7c;
  HistoryEntry *in_stack_ffffffffffffff80;
  HistoryEntry *in_stack_ffffffffffffff88;
  QGenericArrayOps<QTextBrowserPrivate::HistoryEntry> *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_ESI != 0) || (in_RCX != 0)) ||
      (bVar2 = needsDetach((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)
                           in_stack_ffffffffffffff80), bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)&DAT_aaaaaaaaaaaaaaaa,
                 -0x5555555555555556,0xaaaaaaaa);
    if (0 < in_RDX) {
      qt_noop();
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)
                          in_stack_ffffffffffffff80);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QGenericArrayOps<QTextBrowserPrivate::HistoryEntry> *)
                  operator->((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)
                             &stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)0x6e3a9c);
        begin((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)0x6e3aab);
        QtPrivate::QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>::copyAppend
                  (this_00,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      }
      else {
        in_stack_ffffffffffffff80 =
             (HistoryEntry *)
             operator->((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)
                        &stack0xffffffffffffffe0);
        b = begin((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)0x6e3ae1);
        begin((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)0x6e3af0);
        QtPrivate::QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>::moveAppend
                  (in_stack_ffffffffffffff90,b,in_stack_ffffffffffffff80);
      }
    }
    swap((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)in_stack_ffffffffffffff80,
         (QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)
         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (in_RCX != 0) {
      swap((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)in_stack_ffffffffffffff80,
           (QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)
           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    ~QArrayDataPointer((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)
                       in_stack_ffffffffffffff80);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity
              ((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)in_stack_ffffffffffffff80);
    freeSpaceAtEnd((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)in_stack_ffffffffffffff88
                  );
    QtPrivate::QMovableArrayOps<QTextBrowserPrivate::HistoryEntry>::reallocate
              ((QMovableArrayOps<QTextBrowserPrivate::HistoryEntry> *)in_stack_ffffffffffffff88,
               (qsizetype)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }